

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * __thiscall
RPCArg::ToString_abi_cxx11_(string *__return_storage_ptr__,RPCArg *this,bool oneline)

{
  long lVar1;
  pointer pRVar2;
  RPCArg *pRVar3;
  string_view func;
  string_view func_00;
  bool bVar4;
  NonFatalCheckError *this_00;
  runtime_error *this_01;
  undefined7 in_register_00000011;
  RPCArg *this_02;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  RPCArg *item;
  pointer this_03;
  long in_FS_OFFSET;
  string_view msg;
  string_view msg_00;
  string_view file;
  string_view file_00;
  string res;
  string local_78;
  string ret;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((int)CONCAT71(in_register_00000011,oneline) == 0) ||
     ((this->m_opts).oneline_description._M_string_length == 0)) {
    if (RANGE < this->m_type) {
      this_00 = (NonFatalCheckError *)__cxa_allocate_exception(0x10);
      func._M_str = "ToString";
      func._M_len = 8;
      msg._M_str = "Unreachable code reached (non-fatal)";
      msg._M_len = 0x24;
      file._M_str = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp";
      file._M_len = 0x55;
      NonFatalCheckError::NonFatalCheckError(this_00,msg,file,0x510,func);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(this_00,&NonFatalCheckError::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00300331;
    }
    switch(this->m_type) {
    case OBJ:
    case OBJ_NAMED_PARAMS:
    case OBJ_USER_KEYS:
      ret._M_string_length = 0;
      ret.field_2._M_local_buf[0] = '\0';
      pRVar2 = (this->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
               super__Vector_impl_data._M_finish;
      bVar4 = true;
      ret._M_dataplus._M_p = (pointer)&ret.field_2;
      for (this_03 = (this->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                     super__Vector_impl_data._M_start; this_03 != pRVar2; this_03 = this_03 + 1) {
        if (!bVar4) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&ret,",");
        }
        ToStringObj_abi_cxx11_(&local_78,this_03,oneline);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&ret,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        bVar4 = false;
      }
      res._M_dataplus._M_p = (pointer)&res.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ret._M_dataplus._M_p == &ret.field_2) {
        res.field_2._8_8_ = ret.field_2._8_8_;
      }
      else {
        res._M_dataplus = ret._M_dataplus;
      }
      res.field_2._M_allocated_capacity._1_7_ = ret.field_2._M_allocated_capacity._1_7_;
      res.field_2._M_local_buf[0] = ret.field_2._M_local_buf[0];
      res._M_string_length = ret._M_string_length;
      ret._M_string_length = 0;
      ret.field_2._M_local_buf[0] = '\0';
      ret._M_dataplus._M_p = (pointer)&ret.field_2;
      std::__cxx11::string::~string((string *)&ret);
      if (this->m_type == OBJ) {
        std::operator+(&ret,"{",&res);
        std::operator+(__return_storage_ptr__,&ret,"}");
      }
      else {
        std::operator+(&ret,"{",&res);
        std::operator+(__return_storage_ptr__,&ret,",...}");
      }
      std::__cxx11::string::~string((string *)&ret);
      psVar5 = &res;
      break;
    case ARR:
      ret._M_string_length = 0;
      ret.field_2._M_local_buf[0] = '\0';
      pRVar3 = (this->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
               super__Vector_impl_data._M_finish;
      ret._M_dataplus._M_p = (pointer)&ret.field_2;
      for (this_02 = (this->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                     super__Vector_impl_data._M_start; this_02 != pRVar3; this_02 = this_02 + 1) {
        ToString_abi_cxx11_(&res,this_02,oneline);
        std::operator+(&local_78,&res,",");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&ret,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&res);
      }
      std::operator+(&local_78,"[",&ret);
      std::operator+(__return_storage_ptr__,&local_78,"...]");
      std::__cxx11::string::~string((string *)&local_78);
      psVar5 = &ret;
      break;
    case STR:
    case STR_HEX:
      GetFirstName_abi_cxx11_(&local_78,this);
      std::operator+(&ret,"\"",&local_78);
      std::operator+(__return_storage_ptr__,&ret,"\"");
      std::__cxx11::string::~string((string *)&ret);
      psVar5 = &local_78;
      break;
    default:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        GetFirstName_abi_cxx11_(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      goto LAB_00300331;
    }
    std::__cxx11::string::~string((string *)psVar5);
  }
  else {
    psVar5 = &(this->m_opts).oneline_description;
    if (((*(psVar5->_M_dataplus)._M_p == '\"') && (this->m_type != STR)) &&
       (this->m_type != STR_HEX)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ret,"-rpcdoccheck",(allocator<char> *)&local_78);
      bVar4 = ArgsManager::GetBoolArg(&gArgs,&ret,false);
      std::__cxx11::string::~string((string *)&ret);
      if (bVar4) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                  (&local_78,
                   (tinyformat *)"non-string RPC arg \"%s\" quotes oneline_description:\n%s",
                   (char *)this,psVar5,in_R8);
        func_00._M_str = "ToString";
        func_00._M_len = 8;
        msg_00._M_str = local_78._M_dataplus._M_p;
        msg_00._M_len = local_78._M_string_length;
        file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
        ;
        file_00._M_len = 0x55;
        StrFormatInternalBug_abi_cxx11_(&ret,msg_00,file_00,0x4ed,func_00);
        std::runtime_error::runtime_error(this_01,(string *)&ret);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00300331;
      }
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,psVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
LAB_00300331:
  __stack_chk_fail();
}

Assistant:

std::string RPCArg::ToString(const bool oneline) const
{
    if (oneline && !m_opts.oneline_description.empty()) {
        if (m_opts.oneline_description[0] == '\"' && m_type != Type::STR_HEX && m_type != Type::STR && gArgs.GetBoolArg("-rpcdoccheck", DEFAULT_RPC_DOC_CHECK)) {
            throw std::runtime_error{
                STR_INTERNAL_BUG(strprintf("non-string RPC arg \"%s\" quotes oneline_description:\n%s",
                    m_names, m_opts.oneline_description)
                )};
        }
        return m_opts.oneline_description;
    }

    switch (m_type) {
    case Type::STR_HEX:
    case Type::STR: {
        return "\"" + GetFirstName() + "\"";
    }
    case Type::NUM:
    case Type::RANGE:
    case Type::AMOUNT:
    case Type::BOOL: {
        return GetFirstName();
    }
    case Type::OBJ:
    case Type::OBJ_NAMED_PARAMS:
    case Type::OBJ_USER_KEYS: {
        // NOLINTNEXTLINE(misc-no-recursion)
        const std::string res = Join(m_inner, ",", [&](const RPCArg& i) { return i.ToStringObj(oneline); });
        if (m_type == Type::OBJ) {
            return "{" + res + "}";
        } else {
            return "{" + res + ",...}";
        }
    }
    case Type::ARR: {
        std::string res;
        for (const auto& i : m_inner) {
            res += i.ToString(oneline) + ",";
        }
        return "[" + res + "...]";
    }
    } // no default case, so the compiler can warn about missing cases
    NONFATAL_UNREACHABLE();
}